

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi_lmo5.cpp
# Opt level: O1

void anon_unknown.dwarf_efe25::cross_off
               (BitSieve *sieve,int64_t low,int64_t high,int64_t prime,WheelItem *w)

{
  ulong *puVar1;
  pointer puVar2;
  long lVar3;
  int8_t iVar4;
  
  lVar3 = w->next_multiple;
  iVar4 = w->wheel_index;
  if (lVar3 < high) {
    puVar2 = (sieve->sieve_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    do {
      puVar1 = puVar2 + ((ulong)(lVar3 - low) >> 7);
      *puVar1 = *puVar1 & ~(&primesum::BitSieve::set_bit_)[(uint)(lVar3 - low) & 0x7f];
      lVar3 = lVar3 + (char)primesum::Wheel::next[(long)iVar4 * 2] * prime;
      iVar4 = primesum::Wheel::next[(long)iVar4 * 2 + 1];
    } while (lVar3 < high);
  }
  w->next_multiple = lVar3;
  w->wheel_index = iVar4;
  return;
}

Assistant:

void cross_off(BitSieve& sieve,
               int64_t low,
               int64_t high,
               int64_t prime,
               WheelItem& w)
{
  int64_t m = w.next_multiple;
  int64_t wheel_index = w.wheel_index;

  for (; m < high; m += prime * Wheel::next_multiple_factor(&wheel_index))
    sieve.unset(m - low);

  w.set(m, wheel_index);
}